

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_ocaml_generator.cc
# Opt level: O1

void __thiscall
t_ocaml_generator::generate_deserialize_field
          (t_ocaml_generator *this,ostream *out,t_field *tfield,string *prefix)

{
  t_type *type;
  pointer pcVar1;
  char *pcVar2;
  long lVar3;
  int iVar4;
  ostream *poVar5;
  string name;
  char *local_70;
  char local_60 [8];
  undefined8 uStack_58;
  char *local_50;
  long local_48;
  char local_40 [8];
  undefined8 uStack_38;
  
  type = tfield->type_;
  pcVar1 = (tfield->name_)._M_dataplus._M_p;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + (tfield->name_)._M_string_length);
  pcVar2 = local_50;
  iVar4 = tolower((int)*local_50);
  *pcVar2 = (char)iVar4;
  lVar3 = local_48;
  if (local_50 == local_40) {
    uStack_58 = uStack_38;
    local_70 = local_60;
  }
  else {
    local_70 = local_50;
  }
  local_48 = 0;
  local_40[0] = '\0';
  local_50 = local_40;
  poVar5 = t_generator::indent((t_generator *)this,out);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"#set_",5);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_70,lVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
  generate_deserialize_type(this,out,type);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  return;
}

Assistant:

void t_ocaml_generator::generate_deserialize_field(ostream& out, t_field* tfield, string prefix) {
  t_type* type = tfield->get_type();

  string name = decapitalize(tfield->get_name());
  indent(out) << prefix << "#set_" << name << " ";
  generate_deserialize_type(out, type);
  out << endl;
}